

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O2

bool __thiscall FConfigFile::SetSection(FConfigFile *this,char *name,bool allowCreate)

{
  FConfigSection *pFVar1;
  
  pFVar1 = FindSection(this,name);
  if (pFVar1 == (FConfigSection *)0x0 && allowCreate) {
    pFVar1 = NewConfigSection(this,name);
  }
  else if (pFVar1 == (FConfigSection *)0x0) {
    return false;
  }
  this->CurrentSection = pFVar1;
  this->CurrentEntry = pFVar1->RootEntry;
  return true;
}

Assistant:

bool FConfigFile::SetSection (const char *name, bool allowCreate)
{
	FConfigSection *section = FindSection (name);
	if (section == NULL && allowCreate)
	{
		section = NewConfigSection (name);
	}
	if (section != NULL)
	{
		CurrentSection = section;
		CurrentEntry = section->RootEntry;
		return true;
	}
	return false;
}